

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

size_t __thiscall
XPMP2::UDPMulticast::RecvMC
          (UDPMulticast *this,bool bSwitchToRecvIntf,string *_pFromAddr,SockAddrTy *_pFromSockAddr,
          bool *_pbIntfChanged)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  string *__cmsg;
  int *piVar3;
  mapped_type *pmVar4;
  rep rVar5;
  NetRuntimeError *pNVar6;
  long lVar7;
  ushort uVar8;
  uint32_t idx;
  SockAddrTy sa;
  msghdr msg;
  iovec iovec;
  char msg_control [1024];
  string local_4c8;
  anon_union_28_3_5f5bb294_for_SockAddrTy_0 local_4a8;
  msghdr local_480;
  iovec local_448;
  string local_438 [32];
  
  if (((this->pMCAddr == (addrinfo *)0x0) ||
      (__s = (this->super_SocketNetworking).buf, __s == (char *)0x0)) ||
     ((this->super_SocketNetworking).f_socket == -1)) {
    pNVar6 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,"RecvMC: Multicast socket not initialized","");
    NetRuntimeError::NetRuntimeError(pNVar6,local_438);
    __cxa_throw(pNVar6,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  local_4a8._16_4_ = 0;
  local_4a8._20_8_ = 0;
  local_4a8._8_4_ = 0;
  local_4a8._12_4_ = 0;
  uVar8 = CONCAT11(0,(byte)this->pMCAddr->ai_family);
  local_4a8._2_6_ = 0;
  local_4a8.sa.sa_family = uVar8;
  memset(__s,0,(this->super_SocketNetworking).bufSize);
  local_448.iov_base = (this->super_SocketNetworking).buf;
  local_480.msg_iov = &local_448;
  local_448.iov_len = (this->super_SocketNetworking).bufSize;
  local_480.msg_namelen = 0x10;
  if (uVar8 == 10) {
    local_480.msg_namelen = 0x1c;
  }
  local_480.msg_iovlen = 1;
  local_480.msg_control = local_438;
  local_480.msg_controllen = 0x400;
  local_480.msg_flags = 0;
  local_480.msg_name = &local_4a8;
  sVar2 = recvmsg((this->super_SocketNetworking).f_socket,&local_480,0);
  if ((long)sVar2 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 0xb) {
      pNVar6 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4c8,"RecvMC: recvfrom failed","");
      NetRuntimeError::NetRuntimeError(pNVar6,&local_4c8);
      __cxa_throw(pNVar6,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
    }
    sVar2 = 0;
    idx = 0;
  }
  else {
    idx = 0;
    if ((bSwitchToRecvIntf && sVar2 != 0) &&
       (idx = 0, (string *)local_480.msg_control != (string *)0x0 && 0xf < local_480.msg_controllen)
       ) {
      __cmsg = (string *)local_480.msg_control;
      do {
        if (local_4a8.sa.sa_family._0_1_ == '\n') {
          if (((int)__cmsg->_M_string_length == 0x29) &&
             (*(int *)((long)&__cmsg->_M_string_length + 4) == 0x32)) {
            lVar7 = 0x20;
            goto LAB_00231736;
          }
        }
        else if (((local_4a8.sa.sa_family._0_1_ == '\x02') && ((int)__cmsg->_M_string_length == 0))
                && (*(int *)((long)&__cmsg->_M_string_length + 4) == 8)) {
          lVar7 = 0x10;
LAB_00231736:
          idx = *(uint32_t *)((long)&(__cmsg->_M_dataplus)._M_p + lVar7);
          break;
        }
        __cmsg = (string *)__cmsg_nxthdr(&local_480,(cmsghdr *)__cmsg);
      } while (__cmsg != (string *)0x0);
    }
  }
  if (bSwitchToRecvIntf) {
    pmVar4 = std::
             map<XPMP2::SockAddrTy,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::less<XPMP2::SockAddrTy>,_std::allocator<std::pair<const_XPMP2::SockAddrTy,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
             ::operator[](&this->mapSender,(key_type *)&local_4a8.sa);
    lVar7 = std::chrono::_V2::steady_clock::now();
    if (lVar7 - (pmVar4->__d).__r < 180000000000) {
      idx = 0;
    }
    rVar5 = std::chrono::_V2::steady_clock::now();
    (pmVar4->__d).__r = rVar5;
    if ((idx == 0) || (idx == this->oneIntfIdx)) goto LAB_002316ac;
    SendToIntf(this,idx);
    bVar1 = true;
    if (_pbIntfChanged == (bool *)0x0) goto LAB_002316b9;
  }
  else {
LAB_002316ac:
    if (_pbIntfChanged == (bool *)0x0) goto LAB_002316b9;
    bVar1 = false;
  }
  *_pbIntfChanged = bVar1;
LAB_002316b9:
  if (_pFromAddr != (string *)0x0) {
    SocketNetworking::GetAddrString_abi_cxx11_
              (&local_4c8,(SocketNetworking *)&local_4a8.sa,(SockAddrTy *)0x1,
               SUB81(_pbIntfChanged,0));
    std::__cxx11::string::operator=((string *)_pFromAddr,(string *)&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (_pFromSockAddr != (SockAddrTy *)0x0) {
    *(ulong *)((long)&_pFromSockAddr->field_0 + 0xc) = CONCAT44(local_4a8._16_4_,local_4a8._12_4_);
    *(undefined8 *)((long)&_pFromSockAddr->field_0 + 0x14) = local_4a8._20_8_;
    *(undefined8 *)&_pFromSockAddr->field_0 = local_4a8._0_8_;
    *(ulong *)((long)&_pFromSockAddr->field_0 + 8) = CONCAT44(local_4a8._12_4_,local_4a8._8_4_);
  }
  return sVar2;
}

Assistant:

size_t UDPMulticast::RecvMC (bool bSwitchToRecvIntf,
                             std::string* _pFromAddr,
                             SockAddrTy* _pFromSockAddr,
                             bool* _pbIntfChanged)
{

    if (!pMCAddr || !buf || !isOpen())
        throw NetRuntimeError("RecvMC: Multicast socket not initialized");
    
    // Information vairables filled during the rcvmsg operation
    SockAddrTy sa;                              // socket address
    sa.sa.sa_family = GetFamily();
    uint32_t ifIdx = 0;                         // interface index the msg was received on

    memset(buf, 0, bufSize);
    ssize_t bytesRcvd = 0;
#if IBM
    // Set up msg header
    // Originally based on https://stackoverflow.com/a/37334943
    char msg_control[1024] = "";
    WSABUF  wsaBuf = { static_cast<ULONG>(bufSize), buf };
    DWORD br = 0;
    WSAMSG  msg = {
        &sa.sa,                 // LPSOCKADDR       name;              /* Remote address */
        sa.size(),              // INT              namelen;           /* Remote address length */
        &wsaBuf,                // LPWSABUF         lpBuffers;         /* Data buffer array */
        1,                      // ULONG            dwBufferCount;     /* Number of elements in the array */
        {                       // WSABUF           Control;           /* Control buffer */
            sizeof(msg_control),
            msg_control
        },
        0                       // ULONG            dwFlags;           /* Flags */
    };

    // Receive the message, fill the control info
    if (WSARecvMsg(&msg, &br, nullptr, nullptr) < 0) {
        if (errno != WSAEWOULDBLOCK)            // we ignore no-data events
            throw NetRuntimeError("RecvMC: WSARecvMsg failed");
    }
    bytesRcvd = (ssize_t)br;

    // loop the control headers to find which interface the msg was received on
    if (bytesRcvd > 0 && bSwitchToRecvIntf) {
        for (WSACMSGHDR* cmsg = WSA_CMSG_FIRSTHDR(&msg);
             cmsg;
             cmsg = WSA_CMSG_NXTHDR(&msg, cmsg))
        {
            if (sa.isIp4() && cmsg->cmsg_level == IPPROTO_IP && cmsg->cmsg_type == IP_PKTINFO)
            {
                const struct in_pktinfo* in_pktinfo = (struct in_pktinfo*)WSA_CMSG_DATA(cmsg);
                ifIdx = in_pktinfo->ipi_ifindex;
                break;
            }
            if (sa.isIp6() && cmsg->cmsg_level == IPPROTO_IPV6 && cmsg->cmsg_type == IPV6_PKTINFO)
            {
                const struct in6_pktinfo* in6_pktinfo = (struct in6_pktinfo*)WSA_CMSG_DATA(cmsg);
                ifIdx = in6_pktinfo->ipi6_ifindex;
                break;
            }
        }
    }

#else
    // Set up msg header
    // Originally based on https://stackoverflow.com/a/12398774
    char msg_control[1024];
    struct iovec iovec = { buf, bufSize };
    struct msghdr msg = {
        &sa.sa,                 //    void            *msg_name;      /* [XSI] optional address */
        sa.size(),              //    socklen_t       msg_namelen;    /* [XSI] size of address */
        &iovec,                 //    struct          iovec *msg_iov; /* [XSI] scatter/gather array */
        1,                      //    int             msg_iovlen;     /* [XSI] # elements in msg_iov */
        msg_control,            //    void            *msg_control;   /* [XSI] ancillary data, see below */
        sizeof(msg_control),    //    socklen_t       msg_controllen; /* [XSI] ancillary data buffer len */
        0                       //    int             msg_flags;      /* [XSI] flags on received message */
    };

    // Receive the message, fill the control info
    bytesRcvd = recvmsg(f_socket, &msg, 0);
    // We don't treat EAGAIN as an error...that just means we received nothing
    if (bytesRcvd < 0 && errno == EAGAIN)
        bytesRcvd = 0;
    if (bytesRcvd < 0)
        throw NetRuntimeError("RecvMC: recvfrom failed");

    // loop the control headers to find which interface the msg was received on
    if (bytesRcvd > 0 && bSwitchToRecvIntf) {
        for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg); cmsg != 0; cmsg = CMSG_NXTHDR(&msg, cmsg))
        {
            if (sa.isIp4() && cmsg->cmsg_level == IPPROTO_IP && cmsg->cmsg_type == IP_PKTINFO)
            {
                const struct in_pktinfo* in_pktinfo = (struct in_pktinfo*)CMSG_DATA(cmsg);
                ifIdx = in_pktinfo->ipi_ifindex;
                break;
            }
            if (sa.isIp6() && cmsg->cmsg_level == IPPROTO_IPV6 && cmsg->cmsg_type == IPV6_PKTINFO)
            {
                const struct in6_pktinfo* in6_pktinfo = (struct in6_pktinfo*)CMSG_DATA(cmsg);
                ifIdx = in6_pktinfo->ipi6_ifindex;
                break;
            }
        }
    }
#endif
    
    // Was that packet send from someplace we didn't hear yet or in some time?
    if (bSwitchToRecvIntf) {
        std::chrono::time_point<std::chrono::steady_clock> &lastRcvd = mapSender[sa];
        if (std::chrono::steady_clock::now() - lastRcvd < std::chrono::seconds(180))
            ifIdx = 0;                      // we know that sender and have heard from it in past 3 minutes, don't switch interface because of it
        lastRcvd = std::chrono::steady_clock::now();
    }
    
    // If requested, set outgoing interface (quick exit if no change)
    if (bSwitchToRecvIntf && ifIdx && ifIdx != oneIntfIdx) {
        SendToIntf(ifIdx);
        if (_pbIntfChanged) *_pbIntfChanged = true;
    }
    else
        if (_pbIntfChanged) *_pbIntfChanged = false;
        

    // Sender address wanted?
    if (_pFromAddr)
        *_pFromAddr = GetAddrString(sa);
    if (_pFromSockAddr)
        *_pFromSockAddr = sa;
    
    return size_t(bytesRcvd);
}